

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read.c
# Opt level: O1

int archive_read_open1(archive *_a)

{
  size_t *psVar1;
  code *pcVar2;
  undefined8 *puVar3;
  char *pcVar4;
  bool bVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  char *pcVar9;
  size_t *psVar10;
  char *pcVar11;
  int iVar12;
  uint uVar13;
  ulong uVar14;
  uint uVar15;
  char **ppcVar16;
  char **ppcVar17;
  long lVar18;
  ssize_t avail;
  long local_38;
  
  iVar7 = __archive_check_magic(_a,0xdeb0c5,1,"archive_read_open");
  if (iVar7 == -0x1e) {
    return -0x1e;
  }
  archive_clear_error(_a);
  if (_a[1].current_code == (char *)0x0) {
    archive_set_error(_a,0x16,"No reader function provided to archive_read_open");
LAB_003fee84:
    _a->state = 0x8000;
    iVar7 = -0x1e;
  }
  else {
    pcVar2 = (code *)_a[1].error_string.buffer_length;
    if ((pcVar2 != (code *)0x0) &&
       (iVar7 = (*pcVar2)(_a,*(undefined8 *)(*(long *)&_a[2].compression_code + 0x10)), iVar7 != 0))
    {
      lVar18._0_4_ = _a[2].magic;
      lVar18._4_4_ = _a[2].state;
      if (lVar18 == 0) {
        return iVar7;
      }
      if (_a[2].archive_format == 0) {
        return iVar7;
      }
      lVar18 = 0x10;
      uVar14 = 0;
      do {
        (**(code **)(_a + 2))(_a,*(undefined8 *)(*(long *)&_a[2].compression_code + lVar18));
        uVar14 = uVar14 + 1;
        lVar18 = lVar18 + 0x18;
      } while (uVar14 < (uint)_a[2].archive_format);
      return iVar7;
    }
    pcVar9 = (char *)calloc(1,0xb0);
    if (pcVar9 == (char *)0x0) {
      return -0x1e;
    }
    pcVar9[8] = '\0';
    pcVar9[9] = '\0';
    pcVar9[10] = '\0';
    pcVar9[0xb] = '\0';
    pcVar9[0xc] = '\0';
    pcVar9[0xd] = '\0';
    pcVar9[0xe] = '\0';
    pcVar9[0xf] = '\0';
    pcVar9[0x10] = '\0';
    pcVar9[0x11] = '\0';
    pcVar9[0x12] = '\0';
    pcVar9[0x13] = '\0';
    pcVar9[0x14] = '\0';
    pcVar9[0x15] = '\0';
    pcVar9[0x16] = '\0';
    pcVar9[0x17] = '\0';
    *(archive **)(pcVar9 + 0x18) = _a;
    puVar3 = *(undefined8 **)&_a[2].compression_code;
    *(undefined8 *)(pcVar9 + 0x50) = puVar3[2];
    *(code **)(pcVar9 + 0x20) = client_open_proxy;
    *(code **)(pcVar9 + 0x28) = client_read_proxy;
    *(code **)(pcVar9 + 0x30) = client_skip_proxy;
    *(code **)(pcVar9 + 0x38) = client_seek_proxy;
    *(code **)(pcVar9 + 0x40) = client_close_proxy;
    *(code **)(pcVar9 + 0x48) = client_switch_proxy;
    *(char **)(pcVar9 + 0x58) = "none";
    pcVar9[0x60] = '\0';
    pcVar9[0x61] = '\0';
    pcVar9[0x62] = '\0';
    pcVar9[99] = '\0';
    *puVar3 = 0;
    if ((_a[8].compression_name == (char *)0x0) ||
       (pcVar4 = _a[8].compression_name, _a[8].file_count == 0)) {
      _a[8].compression_name = pcVar9;
      iVar12 = 0;
      ppcVar16 = (char **)0x0;
      iVar7 = 0;
      ppcVar17 = &_a[2].compression_name;
      do {
        do {
          if (((code *)ppcVar17[2] != (code *)0x0) &&
             (iVar8 = (*(code *)ppcVar17[2])(ppcVar17,_a[8].compression_name), iVar7 < iVar8)) {
            ppcVar16 = ppcVar17;
            iVar7 = iVar8;
          }
          iVar12 = iVar12 + 1;
          ppcVar17 = ppcVar17 + 6;
        } while (iVar12 != 0xe);
        if (ppcVar16 == (char **)0x0) {
          __archive_read_filter_ahead((archive_read_filter *)_a[8].compression_name,1,&local_38);
          if (local_38 < 0) {
            __archive_read_close_filters((archive_read *)_a);
            iVar7 = -0x1e;
            bVar5 = true;
            pcVar9 = _a[8].compression_name;
            while (pcVar9 != (char *)0x0) {
              pcVar4 = *(char **)(pcVar9 + 0x10);
              free(pcVar9);
              _a[8].compression_name = pcVar4;
              pcVar9 = pcVar4;
            }
          }
          else {
            _a->compression_name = *(char **)(_a[8].compression_name + 0x58);
            _a->compression_code = *(int *)(_a[8].compression_name + 0x60);
            bVar5 = false;
            iVar7 = 0;
          }
          goto LAB_003fefe6;
        }
        pcVar9 = (char *)calloc(1,0xb0);
        iVar7 = -0x1e;
        bVar5 = true;
        if (pcVar9 == (char *)0x0) goto LAB_003fefe6;
        *(char ***)(pcVar9 + 8) = ppcVar16;
        *(archive **)(pcVar9 + 0x18) = _a;
        *(char **)(pcVar9 + 0x10) = _a[8].compression_name;
        _a[8].compression_name = pcVar9;
        iVar8 = (*(code *)((archive_string *)(ppcVar16 + 3))->s)(pcVar9);
        iVar12 = 0;
        ppcVar16 = (char **)0x0;
        iVar7 = 0;
        ppcVar17 = &_a[2].compression_name;
      } while (iVar8 == 0);
      __archive_read_close_filters((archive_read *)_a);
      iVar7 = -0x1e;
      pcVar9 = _a[8].compression_name;
      while (pcVar9 != (char *)0x0) {
        pcVar4 = *(char **)(pcVar9 + 0x10);
        free(pcVar9);
        _a[8].compression_name = pcVar4;
        pcVar9 = pcVar4;
      }
LAB_003fefe6:
      if (bVar5) goto LAB_003fee84;
    }
    else {
      do {
        pcVar11 = pcVar4;
        pcVar4 = *(char **)(pcVar11 + 0x10);
      } while (pcVar4 != (char *)0x0);
      *(char **)(pcVar11 + 0x10) = pcVar9;
      iVar7 = 0;
    }
    if (_a[0x15].archive_format_name == (char *)0x0) {
      psVar1 = &_a[8].error_string.length;
      _a[0x15].archive_format_name = (char *)psVar1;
      uVar13 = 0;
      uVar15 = 0xffffffff;
      iVar12 = -1;
      psVar10 = psVar1;
      do {
        uVar6 = uVar15;
        iVar8 = iVar12;
        if ((code *)psVar10[2] != (code *)0x0) {
          iVar8 = (*(code *)psVar10[2])(_a);
          if (iVar8 == -0x1e) goto LAB_003ff0b1;
          if (((archive_read_filter *)_a[8].compression_name)->position != 0) {
            __archive_read_filter_seek((archive_read_filter *)_a[8].compression_name,0,0);
          }
          uVar6 = uVar13;
          if (-1 < (int)uVar15 && iVar8 <= iVar12) {
            uVar6 = uVar15;
            iVar8 = iVar12;
          }
        }
        iVar12 = iVar8;
        uVar15 = uVar6;
        uVar13 = uVar13 + 1;
        psVar10 = (size_t *)(_a[0x15].archive_format_name + 0x58);
        _a[0x15].archive_format_name = (char *)psVar10;
      } while (uVar13 != 0x10);
      if ((int)uVar15 < 0) {
        pcVar9 = "No formats registered";
LAB_003ff0a2:
        archive_set_error(_a,0x54,pcVar9);
LAB_003ff0b1:
        uVar15 = 0xffffffe2;
      }
      else if (iVar12 < 1) {
        pcVar9 = "Unrecognized archive format";
        goto LAB_003ff0a2;
      }
      if ((int)uVar15 < 0) {
        __archive_read_close_filters((archive_read *)_a);
        goto LAB_003fee84;
      }
      _a[0x15].archive_format_name = (char *)(psVar1 + (ulong)uVar15 * 0xb);
    }
    _a->state = 2;
    client_switch_proxy((archive_read_filter *)_a[8].compression_name,0);
  }
  return iVar7;
}

Assistant:

int
archive_read_open1(struct archive *_a)
{
	struct archive_read *a = (struct archive_read *)_a;
	struct archive_read_filter *filter, *tmp;
	int slot, e;
	unsigned int i;

	archive_check_magic(_a, ARCHIVE_READ_MAGIC, ARCHIVE_STATE_NEW,
	    "archive_read_open");
	archive_clear_error(&a->archive);

	if (a->client.reader == NULL) {
		archive_set_error(&a->archive, EINVAL,
		    "No reader function provided to archive_read_open");
		a->archive.state = ARCHIVE_STATE_FATAL;
		return (ARCHIVE_FATAL);
	}

	/* Open data source. */
	if (a->client.opener != NULL) {
		e = (a->client.opener)(&a->archive, a->client.dataset[0].data);
		if (e != 0) {
			/* If the open failed, call the closer to clean up. */
			if (a->client.closer) {
				for (i = 0; i < a->client.nodes; i++)
					(a->client.closer)(&a->archive,
					    a->client.dataset[i].data);
			}
			return (e);
		}
	}

	filter = calloc(1, sizeof(*filter));
	if (filter == NULL)
		return (ARCHIVE_FATAL);
	filter->bidder = NULL;
	filter->upstream = NULL;
	filter->archive = a;
	filter->data = a->client.dataset[0].data;
	filter->open = client_open_proxy;
	filter->read = client_read_proxy;
	filter->skip = client_skip_proxy;
	filter->seek = client_seek_proxy;
	filter->close = client_close_proxy;
	filter->sswitch = client_switch_proxy;
	filter->name = "none";
	filter->code = ARCHIVE_FILTER_NONE;

	a->client.dataset[0].begin_position = 0;
	if (!a->filter || !a->bypass_filter_bidding)
	{
		a->filter = filter;
		/* Build out the input pipeline. */
		e = choose_filters(a);
		if (e < ARCHIVE_WARN) {
			a->archive.state = ARCHIVE_STATE_FATAL;
			return (ARCHIVE_FATAL);
		}
	}
	else
	{
		/* Need to add "NONE" type filter at the end of the filter chain */
		tmp = a->filter;
		while (tmp->upstream)
			tmp = tmp->upstream;
		tmp->upstream = filter;
	}

	if (!a->format)
	{
		slot = choose_format(a);
		if (slot < 0) {
			__archive_read_close_filters(a);
			a->archive.state = ARCHIVE_STATE_FATAL;
			return (ARCHIVE_FATAL);
		}
		a->format = &(a->formats[slot]);
	}

	a->archive.state = ARCHIVE_STATE_HEADER;

	/* Ensure libarchive starts from the first node in a multivolume set */
	client_switch_proxy(a->filter, 0);
	return (e);
}